

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O3

unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
 __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::Make(TimeZoneInfo *this,string *name)

{
  bool bVar1;
  TimeZoneInfo *this_00;
  pointer *__ptr;
  pointer __old_p;
  
  this_00 = (TimeZoneInfo *)operator_new(0xc0);
  (this_00->super_TimeZoneIf)._vptr_TimeZoneIf = (_func_int **)&PTR__TimeZoneInfo_00574970;
  (this_00->transitions_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->transitions_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->transitions_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->transition_types_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->transition_types_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->transition_types_).
  super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->abbreviations_)._M_dataplus._M_p = (pointer)&(this_00->abbreviations_).field_2;
  (this_00->abbreviations_)._M_string_length = 0;
  (this_00->abbreviations_).field_2._M_local_buf[0] = '\0';
  (this_00->version_)._M_dataplus._M_p = (pointer)&(this_00->version_).field_2;
  (this_00->version_)._M_string_length = 0;
  (this_00->version_).field_2._M_local_buf[0] = '\0';
  (this_00->future_spec_)._M_dataplus._M_p = (pointer)&(this_00->future_spec_).field_2;
  (this_00->future_spec_)._M_string_length = 0;
  (this_00->future_spec_).field_2._M_local_buf[0] = '\0';
  (this_00->local_time_hint_).super___atomic_base<unsigned_long>._M_i = 0;
  (this_00->time_local_hint_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_TimeZoneIf)._vptr_TimeZoneIf = (_func_int **)this_00;
  bVar1 = Load(this_00,name);
  if (!bVar1) {
    (this->super_TimeZoneIf)._vptr_TimeZoneIf = (_func_int **)0x0;
    (*(this_00->super_TimeZoneIf)._vptr_TimeZoneIf[1])(this_00);
  }
  return (__uniq_ptr_data<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>,_true,_true>
          )(__uniq_ptr_data<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TimeZoneInfo> TimeZoneInfo::Make(const std::string& name) {
  auto tz = std::unique_ptr<TimeZoneInfo>(new TimeZoneInfo);
  if (!tz->Load(name)) tz.reset();  // fallback to UTC
  return tz;
}